

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SliceBase.h
# Opt level: O1

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getTags
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this)

{
  byte *pbVar1;
  byte bVar2;
  iterator __position;
  unsigned_long in_RAX;
  Exception *this_00;
  long lVar3;
  byte *pbVar4;
  unsigned_long local_28;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pbVar4 = *(byte **)this;
  if ((*pbVar4 & 0xfe) == 0xee) {
    bVar2 = *pbVar4;
    local_28 = in_RAX;
    while ((bVar2 & 0xfe) == 0xee) {
      if (*pbVar4 == 0xef) {
        local_28 = *(unsigned_long *)(pbVar4 + 1);
        lVar3 = 9;
      }
      else {
        if (*pbVar4 != 0xee) {
          this_00 = (Exception *)__cxa_allocate_exception(0x18);
          Exception::Exception(this_00,InternalError,"Invalid tag type ID");
          __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
        }
        local_28 = (unsigned_long)pbVar4[1];
        lVar3 = 2;
      }
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)__return_storage_ptr__,
                   __position,&local_28);
      }
      else {
        *__position._M_current = local_28;
        (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
        _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      pbVar1 = pbVar4 + lVar3;
      pbVar4 = pbVar4 + lVar3;
      bVar2 = *pbVar1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint64_t> getTags() const {
    std::vector<uint64_t> ret;

    if (isTagged()) {
      // always need the actual first byte, so use ptr() directly
      uint8_t const* start = ptr();

      while (SliceStaticData::TypeMap[*start] == ValueType::Tagged) {
        uint8_t offset;
        uint64_t tag;

        if (*start == 0xee) {
          tag = readIntegerFixed<uint64_t, 1>(start + 1);
          offset = 2;
        } else if (*start == 0xef) {
          tag = readIntegerFixed<uint64_t, 8>(start + 1);
          offset = 9;
        } else {
          throw Exception(Exception::InternalError, "Invalid tag type ID");
        }

        ret.push_back(tag);
        start += offset;
      }
    }

    return ret;
  }